

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_or.h
# Opt level: O3

void __thiscall
draco::StatusOr<std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>_>::
~StatusOr(StatusOr<std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>_>
          *this)

{
  MeshDecoder *pMVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  pMVar1 = (this->value_)._M_t.
           super___uniq_ptr_impl<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>._M_t.
           super__Tuple_impl<0UL,_draco::MeshDecoder_*,_std::default_delete<draco::MeshDecoder>_>.
           super__Head_base<0UL,_draco::MeshDecoder_*,_false>._M_head_impl;
  if (pMVar1 != (MeshDecoder *)0x0) {
    (**(code **)((long)(pMVar1->super_PointCloudDecoder)._vptr_PointCloudDecoder + 8))();
  }
  (this->value_)._M_t.
  super___uniq_ptr_impl<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>._M_t.
  super__Tuple_impl<0UL,_draco::MeshDecoder_*,_std::default_delete<draco::MeshDecoder>_>.
  super__Head_base<0UL,_draco::MeshDecoder_*,_false>._M_head_impl = (MeshDecoder *)0x0;
  pcVar2 = (this->status_).error_msg_._M_dataplus._M_p;
  paVar3 = &(this->status_).error_msg_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

StatusOr() {}